

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap.cpp
# Opt level: O1

void Assimp::Bitmap::WriteHeader(Header *header,IOStream *file)

{
  uint8_t data [14];
  uint16_t local_e;
  uint32_t local_c;
  uint16_t local_8;
  uint16_t local_6;
  uint32_t local_4;
  
  local_e = header->type;
  local_c = header->size;
  local_8 = header->reserved1;
  local_6 = header->reserved2;
  local_4 = header->offset;
  (*file->_vptr_IOStream[3])(file,&local_e,0xe,1);
  return;
}

Assistant:

void Bitmap::WriteHeader(Header& header, IOStream* file) {
        uint8_t data[Header::header_size];

        std::size_t offset = 0;

        offset += Copy(&data[offset], header.type);
        offset += Copy(&data[offset], header.size);
        offset += Copy(&data[offset], header.reserved1);
        offset += Copy(&data[offset], header.reserved2);
                  Copy(&data[offset], header.offset);

        file->Write(data, Header::header_size, 1);
    }